

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

const_iterator __thiscall Json::Value::begin(Value *this)

{
  undefined1 auVar1 [16];
  undefined8 in_RDX;
  const_iterator cVar2;
  
  if ((this->value_).map_ == (ObjectValues *)0x0 || (*(ushort *)&this->field_0x8 & 0xfe) != 6) {
    auVar1._1_7_ = (int7)((ulong)in_RDX >> 8);
    auVar1[0] = 1;
    auVar1._8_8_ = 0;
    return (ValueIteratorBase)(auVar1 << 0x40);
  }
  cVar2.super_ValueIteratorBase._8_8_ = 0;
  cVar2.super_ValueIteratorBase.current_._M_node =
       (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  return (const_iterator)cVar2.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator Value::begin() const {
  switch (type_) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return const_iterator(value_.map_->begin());
    break;
  default:
    break;
  }
  return const_iterator();
}